

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<int,double>,int,double,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  ulong uVar1;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  AggregateBinaryInput local_e8;
  long *local_c0;
  long local_b8;
  ValidityMask local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  ValidityMask local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
  local_e8.left_mask = &local_68;
  local_e8.right_mask = &local_b0;
  local_e8.input = aggr_input_data;
  if (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_mask == (unsigned_long *)0x0 &&
      local_68.super_TemplatedValidityMask<unsigned_long>.validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = 0;
      do {
        local_e8.lidx = uVar1;
        if (*local_78 != 0) {
          local_e8.lidx = (idx_t)*(uint *)(*local_78 + uVar1 * 4);
        }
        local_e8.ridx = uVar1;
        if (*local_c0 != 0) {
          local_e8.ridx = (idx_t)*(uint *)(*local_c0 + uVar1 * 4);
        }
        ArgMinMaxBase<duckdb::LessThan,true>::
        Operation<int,double,duckdb::ArgMinMaxState<int,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
                  ((ArgMinMaxState<int,_double> *)state,(int *)(local_e8.lidx * 4 + local_70),
                   (double *)(local_b8 + local_e8.ridx * 8),&local_e8);
        uVar1 = uVar1 + 1;
      } while (count != uVar1);
    }
  }
  else if (count != 0) {
    uVar1 = 0;
    do {
      local_e8.lidx = uVar1;
      if (*local_78 != 0) {
        local_e8.lidx = (idx_t)*(uint *)(*local_78 + uVar1 * 4);
      }
      local_e8.ridx = uVar1;
      if (*local_c0 != 0) {
        local_e8.ridx = (idx_t)*(uint *)(*local_c0 + uVar1 * 4);
      }
      if (((local_68.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_68.super_TemplatedValidityMask<unsigned_long>.validity_mask[local_e8.lidx >> 6] >>
            (local_e8.lidx & 0x3f) & 1) != 0)) &&
         ((local_b0.super_TemplatedValidityMask<unsigned_long>.validity_mask == (unsigned_long *)0x0
          || ((local_b0.super_TemplatedValidityMask<unsigned_long>.validity_mask[local_e8.ridx >> 6]
               >> (local_e8.ridx & 0x3f) & 1) != 0)))) {
        ArgMinMaxBase<duckdb::LessThan,true>::
        Operation<int,double,duckdb::ArgMinMaxState<int,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
                  ((ArgMinMaxState<int,_double> *)state,(int *)(local_e8.lidx * 4 + local_70),
                   (double *)(local_b8 + local_e8.ridx * 8),&local_e8);
      }
      uVar1 = uVar1 + 1;
    } while (count != uVar1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}